

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint uVar1;
  bool bVar2;
  uint32_t nn;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint32_t hbits;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t bins [28];
  uint32_t local_a8 [30];
  
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  uVar1 = t->asize;
  iVar12 = 0;
  iVar6 = 0;
  if (uVar1 != 0) {
    lVar5 = 0;
    uVar13 = 0;
    iVar6 = 0;
    do {
      uVar7 = 2 << ((byte)lVar5 & 0x1f);
      uVar11 = (uint)uVar13;
      if ((uVar7 < uVar1) || (bVar2 = true, uVar7 = uVar1 - 1, uVar11 <= uVar1 - 1)) {
        iVar8 = 0;
        if (uVar11 <= uVar7) {
          iVar8 = 0;
          do {
            iVar8 = iVar8 + (uint)(*(int *)((ulong)(t->array).ptr32 + 4 + uVar13 * 8) != -1);
            uVar10 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar10;
          } while (uVar10 <= uVar7);
          uVar13 = (ulong)(uVar11 + 1);
          if (uVar11 + 1 <= uVar7 + 1) {
            uVar13 = (ulong)(uVar7 + 1);
          }
        }
        local_a8[lVar5] = local_a8[lVar5] + iVar8;
        iVar6 = iVar6 + iVar8;
        bVar2 = false;
      }
    } while ((!bVar2) && (lVar5 = lVar5 + 1, lVar5 != 0x1c));
  }
  uVar14 = (ulong)(t->node).ptr32;
  uVar1 = t->hmask;
  iVar8 = 0;
  uVar13 = 0;
  do {
    if (*(int *)(uVar14 + 4 + uVar13 * 0x18) != -1) {
      uVar3 = countint((cTValue *)(uVar14 + uVar13 * 0x18 + 8),local_a8);
      iVar8 = iVar8 + uVar3;
      iVar12 = iVar12 + 1;
    }
    uVar7 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar7;
  } while (uVar7 <= uVar1);
  uVar3 = countint(ek,local_a8);
  iVar4 = uVar3 + iVar8 + iVar6;
  hbits = 0;
  iVar8 = 0;
  uVar3 = 0;
  uVar1 = iVar4 * 2;
  if (uVar1 != 0) {
    uVar7 = 0;
    uVar11 = 1;
    uVar3 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      if (local_a8[uVar7] != 0) {
        iVar9 = iVar9 + local_a8[uVar7];
        if (uVar11 < (uint)(iVar9 * 2)) {
          uVar3 = (2 << ((byte)uVar7 & 0x1f)) + 1;
          iVar8 = iVar9;
        }
      }
      uVar7 = uVar7 + 1;
      uVar11 = 1 << ((byte)uVar7 & 0x1f);
    } while ((uVar11 < uVar1) && (iVar9 != iVar4));
  }
  iVar8 = (iVar6 + iVar12 + 1) - iVar8;
  if ((iVar8 != 0) && (hbits = 1, iVar8 != 1)) {
    uVar1 = 0x1f;
    if (iVar8 - 1U != 0) {
      for (; iVar8 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    hbits = (uVar1 ^ 0xffffffe0) + 0x21;
  }
  resizetab(L,t,uVar3,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  resizetab(L, t, asize, hsize2hbits(total));
}